

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_node_base *str;
  bool bVar1;
  uchar byte;
  int iVar2;
  ostream *poVar3;
  _Elt_pointer pdVar4;
  uintmax_t uVar5;
  uintmax_t *puVar6;
  _Base_ptr p_Var7;
  int iVar8;
  int local_4fc;
  recursive_directory_iterator dir_1;
  FileInfos files;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  path inputDir;
  string filepath;
  byte abStack_418 [488];
  ofstream output;
  
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &files._M_t._M_impl.super__Rb_tree_header._M_header;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (2 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dir,argv[1],(allocator<char> *)&filepath);
    if (((dir._M_string_length != 0) && (dir._M_dataplus._M_p[dir._M_string_length - 1] != '/')) &&
       (dir._M_dataplus._M_p[dir._M_string_length - 1] != '\\')) {
      std::__cxx11::string::append((char *)&dir);
    }
    ghc::filesystem::path::path<std::__cxx11::string,ghc::filesystem::path>
              ((path *)&filepath,&dir,auto_format);
    ghc::filesystem::canonical(&inputDir,(path *)&filepath);
    std::__cxx11::string::~string((string *)&filepath);
    poVar3 = std::operator<<((ostream *)&std::clog,"Reading content of \'");
    std::__cxx11::string::string((string *)&filepath,(string *)&inputDir);
    poVar3 = std::operator<<(poVar3,(string *)&filepath);
    poVar3 = std::operator<<(poVar3,"\' ...");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&filepath);
    ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator(&dir_1,&inputDir);
    iVar2 = 0;
    local_4fc = 0;
    while( true ) {
      ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator
                ((recursive_directory_iterator *)&filepath);
      bVar1 = ghc::filesystem::recursive_directory_iterator::operator!=
                        (&dir_1,(recursive_directory_iterator *)&filepath);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filepath._M_string_length);
      if (!bVar1) break;
      pdVar4 = ((dir_1._impl.
                 super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_dir_iter_stack).c.
               super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pdVar4 == ((dir_1._impl.
                      super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_dir_iter_stack).c.
                    super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pdVar4 = ((dir_1._impl.
                   super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_dir_iter_stack).c.
                 super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      std::__cxx11::string::string
                ((string *)&output,
                 (string *)
                 &(pdVar4[-1]._impl.
                   super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_dir_entry);
      std::__cxx11::string::string((string *)&local_478,(string *)&inputDir);
      std::__cxx11::string::substr((ulong)&filepath,(ulong)&output);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&output);
      if ((CONCAT44(filepath._M_string_length._4_4_,(int)filepath._M_string_length) != 0) &&
         (*filepath._M_dataplus._M_p != '.')) {
        pdVar4 = ((dir_1._impl.
                   super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_dir_iter_stack).c.
                 super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pdVar4 == ((dir_1._impl.
                        super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_dir_iter_stack).c.
                      super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pdVar4 = ((dir_1._impl.
                     super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_dir_iter_stack).c.
                   super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        bVar1 = ghc::filesystem::is_regular_file
                          (&((pdVar4[-1]._impl.
                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_dir_entry)._path);
        if (bVar1) {
          pdVar4 = ((dir_1._impl.
                     super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_dir_iter_stack).c.
                   super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pdVar4 == ((dir_1._impl.
                          super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_dir_iter_stack).c.
                        super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pdVar4 = ((dir_1._impl.
                       super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_dir_iter_stack).c.
                     super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          uVar5 = ghc::filesystem::file_size
                            (&((pdVar4[-1]._impl.
                                super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_dir_entry)._path);
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&filepath);
          poVar3 = std::operator<<(poVar3," (");
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3,")");
          std::endl<char,std::char_traits<char>>(poVar3);
          puVar6 = (uintmax_t *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::operator[](&files,&filepath);
          *puVar6 = uVar5;
          local_4fc = local_4fc + (int)uVar5;
          iVar2 = iVar2 + (int)filepath._M_string_length;
        }
      }
      std::__cxx11::string::~string((string *)&filepath);
      ghc::filesystem::recursive_directory_iterator::operator++(&dir_1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dir_1._impl.
                super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    poVar3 = std::operator<<((ostream *)&std::clog,"Found ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," files with ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_4fc);
    poVar3 = std::operator<<(poVar3," bytes of data, processing...");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::ofstream(&output,argv[2],_S_trunc);
    iVar8 = (int)files._M_t._M_impl.super__Rb_tree_header._M_node_count * 0xc;
    poVar3 = std::operator<<((ostream *)&output,"const int g_resourceDataSize = ");
    iVar2 = iVar8 + iVar2 + local_4fc + 5;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,";");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&output,"const unsigned char g_resourceData[");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,"] = {");
    std::endl<char,std::char_traits<char>>(poVar3);
    writeInt((ostream *)&output,(int)files._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar2 = (int)files._M_t._M_impl.super__Rb_tree_header._M_node_count * 4 + 4;
    for (p_Var7 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &files._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      writeInt((ostream *)&output,iVar2);
      iVar2 = iVar2 + p_Var7[2]._M_color + *(int *)&p_Var7[1]._M_parent + 8;
    }
    iVar2 = (int)files._M_t._M_impl.super__Rb_tree_header._M_node_count * 4 + 4;
    for (p_Var7 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &files._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      poVar3 = std::operator<<((ostream *)&std::clog,"packing \'");
      str = p_Var7 + 1;
      poVar3 = std::operator<<(poVar3,(string *)str);
      poVar3 = std::operator<<(poVar3,"\' ...");
      std::endl<char,std::char_traits<char>>(poVar3);
      if (globalCount != iVar2) {
        poVar3 = std::operator<<((ostream *)&std::clog,"    error: expected offset ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
        poVar3 = std::operator<<(poVar3," current offset ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,globalCount);
        poVar3 = std::operator<<(poVar3," !!!");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      writeInt((ostream *)&output,p_Var7[2]._M_color);
      writeInt((ostream *)&output,*(int *)&p_Var7[1]._M_parent);
      writeString((ostream *)&output,(string *)str);
      std::__cxx11::string::string((string *)&dir_1,(string *)&dir);
      std::operator+(&local_478,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dir_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str);
      std::ifstream::ifstream(&filepath,local_478._M_dataplus._M_p,_S_bin);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&dir_1);
      iVar8 = 0;
      while ((abStack_418[*(long *)(filepath._M_dataplus._M_p + -0x18)] & 2) == 0) {
        byte = std::istream::get();
        if ((abStack_418[*(long *)(filepath._M_dataplus._M_p + -0x18)] & 2) == 0) {
          writeByte((ostream *)&output,byte);
          iVar8 = iVar8 + 1;
        }
      }
      poVar3 = std::operator<<((ostream *)&std::clog," imported ");
      poVar3 = std::operator<<(poVar3,(string *)str);
      poVar3 = std::operator<<(poVar3," with ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar8);
      poVar3 = std::operator<<(poVar3," bytes");
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = iVar2 + p_Var7[2]._M_color + *(int *)&p_Var7[1]._M_parent + 8;
      std::ifstream::~ifstream(&filepath);
    }
    poVar3 = std::operator<<((ostream *)&output,(string *)&lineBuffer_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"0");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&output,"};");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::close();
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,globalCount);
    poVar3 = std::operator<<(poVar3," / ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," bytes done.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ofstream::~ofstream(&output);
    std::__cxx11::string::~string((string *)&inputDir);
    std::__cxx11::string::~string((string *)&dir);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::~_Rb_tree(&files._M_t);
    return 0;
  }
  puts("USAGE: resourcer <directory> <outputfile>");
  exit(-1);
}

Assistant:

int main(int argc, char* argv[])
{
    FileInfos files;
    int totalSize = 0;
    int filenamesSize = 0;
    if (argc < 3) {
        puts("USAGE: resourcer <directory> <outputfile>");
        exit(-1);
    }

    std::string dir = argv[1];
    if (!dir.empty() && dir[dir.length() - 1] != '/' && dir[dir.length() - 1] != '\\') {
        dir += "/";
    }

    fs::path inputDir = fs::canonical(dir);
    std::clog << "Reading content of '" << inputDir.string() << "' ..." << std::endl;

    for (fs::recursive_directory_iterator dir(inputDir); dir != fs::recursive_directory_iterator(); ++dir) {
        std::string filepath = dir->path().string().substr(inputDir.string().length() + 1);
        if (!filepath.empty() && filepath[0] != '.' && fs::is_regular_file(*dir)) {
            long size = (long)fs::file_size(*dir);
            std::cout << filepath << " (" << size << ")" << std::endl;
            files[filepath] = size;
            totalSize += size;
            filenamesSize += filepath.length();
        }
    }

    std::clog << "Found " << files.size() << " files with " << totalSize << " bytes of data, processing..." << std::endl;

    std::ofstream output(argv[2], std::ios::trunc);
    int resourceDataSize = (totalSize + 4 + files.size() * 12 + filenamesSize + 1);
    output << "const int g_resourceDataSize = " << resourceDataSize << ";" << std::endl;
    output << "const unsigned char g_resourceData[" << resourceDataSize << "] = {" << std::endl;
    writeInt(output, files.size());
    int offset = 4 + files.size() * 4;
    for (FileInfos::const_iterator iter = files.begin(); iter != files.end(); ++iter) {
        writeInt(output, offset);
        offset += iter->second + 8 + iter->first.length();
    }
    int checkByteNum = 0;
    offset = 4 + files.size() * 4;
    for (FileInfos::const_iterator iter = files.begin(); iter != files.end(); ++iter) {
        std::clog << "packing '" << iter->first << "' ..." << std::endl;
        if (globalCount != offset) {
            std::clog << "    error: expected offset " << offset << " current offset " << globalCount << " !!!" << std::endl;
        }
        writeInt(output, iter->second);
        writeInt(output, iter->first.length());
        writeString(output, iter->first);
        std::ifstream file((std::string(dir) + iter->first).c_str(), std::ios::binary);
        int c;
        while (!file.eof()) {
            c = file.get();
            if (!file.eof()) {
                writeByte(output, (unsigned char)c);
                ++checkByteNum;
            }
        }
        std::clog << " imported " << iter->first << " with " << checkByteNum << " bytes" << std::endl;
        offset += iter->second + 8 + iter->first.length();
        checkByteNum = 0;
    }
    output << lineBuffer << "0" << std::endl;
    output << "};" << std::endl;
    output.close();
    std::clog << globalCount << " / " << offset << " bytes done." << std::endl;
    return 0;
}